

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

Matrix * MatrixTranspose(Matrix *a)

{
  undefined1 value [16];
  Matrix *a_00;
  uint32_t in_ECX;
  uint32_t col;
  uint columns;
  Matrix *a_01;
  uint32_t row;
  uint rows;
  unkbyte10 in_ST0;
  unkbyte10 in_ST1;
  unkbyte10 in_ST2;
  unkbyte10 in_ST3;
  unkbyte10 in_ST4;
  unkbyte10 in_ST5;
  unkbyte10 in_ST6;
  unkbyte10 in_ST7;
  unkbyte10 Var1;
  undefined6 in_stack_ffffffffffffffd2;
  
  a_00 = MatrixZero(a->columns,a->rows);
  for (rows = 0; rows < a->columns; rows = rows + 1) {
    a_01 = (Matrix *)0x0;
    while (columns = (uint)a_01, columns < a->rows) {
      MatrixGetElement((Real *)a,a_01,rows,in_ECX);
      value._10_6_ = in_stack_ffffffffffffffd2;
      value._0_10_ = in_ST0;
      Var1 = in_ST7;
      MatrixSetElement(a_00,rows,columns,(Real)value);
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = in_ST6;
      in_ST6 = in_ST7;
      in_ST7 = Var1;
      a_01 = (Matrix *)(ulong)(columns + 1);
    }
  }
  return a_00;
}

Assistant:

Matrix *MatrixTranspose(const Matrix *a) {
  Matrix *new = MatrixZero(a->columns, a->rows);
  for (uint32_t row = 0; row < a->columns; ++row) {
    for (uint32_t col = 0; col < a->rows; ++col) {
      MatrixSetElement(new, row, col, MatrixGetElement(a, col, row));
    }
  }
  return new;
}